

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

NonMaximumSuppression_PickTop *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::NonMaximumSuppression_PickTop>
          (Arena *arena)

{
  NonMaximumSuppression_PickTop *this;
  
  if (arena == (Arena *)0x0) {
    this = (NonMaximumSuppression_PickTop *)operator_new(0x18);
    CoreML::Specification::NonMaximumSuppression_PickTop::NonMaximumSuppression_PickTop
              (this,(Arena *)0x0,false);
  }
  else {
    this = (NonMaximumSuppression_PickTop *)
           AllocateAlignedWithHook
                     (arena,0x18,
                      (type_info *)&CoreML::Specification::NonMaximumSuppression_PickTop::typeinfo);
    CoreML::Specification::NonMaximumSuppression_PickTop::NonMaximumSuppression_PickTop
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }